

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.h
# Opt level: O1

int32_t __thiscall
icu_63::UnicodeString::moveIndex32(UnicodeString *this,int32_t index,int32_t delta)

{
  short sVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  char16_t *pcVar5;
  uint uVar6;
  
  sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar3 = (this->fUnion).fFields.fLength;
  }
  else {
    uVar3 = (int)sVar1 >> 5;
  }
  uVar6 = index;
  if ((int)uVar3 < index) {
    uVar6 = uVar3;
  }
  uVar2 = 0;
  if (-1 < index) {
    uVar2 = uVar6;
  }
  if (((int)sVar1 & 2U) == 0) {
    pcVar5 = (this->fUnion).fFields.fArray;
  }
  else {
    pcVar5 = (char16_t *)((long)&this->fUnion + 2);
  }
  if (delta < 1) {
    if ((delta == 0) || ((int)uVar2 < 1)) {
      return uVar2;
    }
    iVar4 = -delta;
    do {
      uVar3 = uVar2 - 1;
      if ((((pcVar5[uVar3] & 0xfc00U) == 0xdc00) && (1 < (int)uVar2)) &&
         ((pcVar5[(ulong)uVar2 - 2] & 0xfc00U) == 0xd800)) {
        uVar3 = uVar2 - 2;
      }
      uVar2 = uVar3;
    } while ((1 < iVar4) && (iVar4 = iVar4 + -1, 0 < (int)uVar2));
  }
  else {
    iVar4 = delta + 1;
    uVar6 = uVar2;
    do {
      if ((int)uVar3 <= (int)uVar6) {
        if (-1 < (int)uVar3) {
          return uVar6;
        }
        if (pcVar5[(int)uVar6] == L'\0') {
          return uVar6;
        }
      }
      uVar2 = uVar6 + 1;
      if ((((pcVar5[(int)uVar6] & 0xfc00U) == 0xd800) && (uVar2 != uVar3)) &&
         ((pcVar5[(int)uVar2] & 0xfc00U) == 0xdc00)) {
        uVar2 = uVar6 + 2;
      }
      iVar4 = iVar4 + -1;
      uVar6 = uVar2;
    } while (1 < iVar4);
  }
  return uVar2;
}

Assistant:

inline UBool
UnicodeString::hasShortLength() const {
  return fUnion.fFields.fLengthAndFlags>=0;
}